

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_retrieveItemByIndex_Test::TestBody(Annotator_retrieveItemByIndex_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_ptr *psVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  ModelPtr model;
  ParserPtr parser;
  shared_ptr<libcellml::Component> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68 [2];
  void *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Annotator::create();
  libcellml::Parser::create(SUB81(local_28,0));
  libcellml::Parser::parseModel(local_38);
  libcellml::Annotator::setModel(local_48);
  psVar2 = local_48;
  local_58 = (void *)0x0;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"duplicateId4","");
  libcellml::Annotator::component((string *)&local_a8,(ulong)psVar2);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)&local_78,"nullptr","annotator->component(\"duplicateId4\", 5)",&local_58,
             &local_a8);
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8b0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_98._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_48;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"duplicateId4","");
  libcellml::Annotator::component((string *)&local_58,(ulong)psVar2);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_a8,"\"component1\"",
             "annotator->component(\"duplicateId4\", 1)->name()",(char (*) [11])"component1",
             &local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8b1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_98._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"duplicateId4","");
  libcellml::Annotator::component((string *)&local_58,(ulong)local_48);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&local_a8,"\"component4\"",
             "annotator->component(\"duplicateId4\", 2)->name()",(char (*) [11])"component4",
             &local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8b2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_98._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

TEST(Annotator, retrieveItemByIndex)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringLotsOfDuplicateIds);

    annotator->setModel(model);

    EXPECT_EQ(nullptr, annotator->component("duplicateId4", 5));
    EXPECT_EQ("component1", annotator->component("duplicateId4", 1)->name());
    EXPECT_EQ("component4", annotator->component("duplicateId4", 2)->name());
}